

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O2

HelicsTranslator
helicsCoreRegisterTranslator(HelicsCore cr,HelicsTranslatorTypes type,char *name,HelicsError *err)

{
  int iVar1;
  Translator *pTVar2;
  _Head_base<0UL,_helics::Translator_*,_false> _Var3;
  __normal_iterator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_*,_std::vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>_>
  __position;
  CoreObject *coreObj;
  _Head_base<0UL,_helics::TranslatorObject_*,_false> _Var4;
  __single_object trans;
  shared_ptr<helics::Core> core;
  _Head_base<0UL,_helics::TranslatorObject_*,_false> local_68;
  __uniq_ptr_impl<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> local_60
  ;
  _Head_base<0UL,_helics::Translator_*,_false> local_58;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  pointer local_30;
  
  getCoreSharedPtr(&local_50,(HelicsError *)cr);
  if (local_50._M_ptr == (element_type *)0x0) {
    _Var4._M_head_impl = (TranslatorObject *)0x0;
  }
  else {
    std::make_unique<helics::TranslatorObject>();
    local_40._M_len = (size_t)local_50._M_ptr;
    local_40._M_str = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
    local_30 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (name != (char *)0x0) {
      local_40._M_str = (char *)strlen(name);
      local_30 = name;
    }
    std::
    make_unique<helics::Translator,helics::Core*,std::basic_string_view<char,std::char_traits<char>>>
              ((Core **)&local_58,&local_40);
    _Var3._M_head_impl = local_58._M_head_impl;
    local_58._M_head_impl = (Translator *)0x0;
    pTVar2 = ((local_68._M_head_impl)->mTrans)._M_t.
             super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>.
             _M_t.
             super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
             super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl;
    ((local_68._M_head_impl)->mTrans)._M_t.
    super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>._M_t.
    super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
    super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl = _Var3._M_head_impl;
    if ((pTVar2 != (Translator *)0x0) &&
       ((**(code **)((long)(pTVar2->super_Interface)._vptr_Interface + 8))(),
       local_58._M_head_impl != (Translator *)0x0)) {
      (*((local_58._M_head_impl)->super_Interface)._vptr_Interface[1])();
    }
    helics::Translator::setTranslatorType
              (((local_68._M_head_impl)->mTrans)._M_t.
               super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>
               .super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl,type);
    (local_68._M_head_impl)->transPtr =
         ((local_68._M_head_impl)->mTrans)._M_t.
         super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>._M_t.
         super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
         super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl;
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_68._M_head_impl)->corePtr).
                super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,&local_50);
    _Var4._M_head_impl = local_68._M_head_impl;
    (local_68._M_head_impl)->custom = type == HELICS_TRANSLATOR_TYPE_CUSTOM;
    local_60._M_t.
    super__Tuple_impl<0UL,_helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>
    .super__Head_base<0UL,_helics::TranslatorObject_*,_false>._M_head_impl =
         (tuple<helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>)
         (tuple<helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>)
         local_68._M_head_impl;
    local_68._M_head_impl = (TranslatorObject *)0x0;
    (_Var4._M_head_impl)->valid = -0x4c83cad2;
    if ((*(long *)((long)cr + 0x28) == *(long *)((long)cr + 0x30)) ||
       (iVar1 = ((_Var4._M_head_impl)->transPtr->super_Interface).handle.hid,
       *(int *)(*(long *)(*(long *)(*(long *)((long)cr + 0x30) + -8) + 8) + 0x10) < iVar1)) {
      std::
      vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>
      ::
      emplace_back<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>
                ((vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>
                  *)((long)cr + 0x28),
                 (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                  *)&local_60);
    }
    else {
      local_40._M_str = (char *)CONCAT44(local_40._M_str._4_4_,iVar1);
      __position = std::
                   upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>*,std::vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>>,helics::InterfaceHandle,__0>
                             ();
      std::
      vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
                        *)((long)cr + 0x28),(const_iterator)__position._M_current,
                       (value_type *)&local_60);
    }
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *)&local_60);
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *)&local_68);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return _Var4._M_head_impl;
}

Assistant:

HelicsTranslator helicsCoreRegisterTranslator(HelicsCore cr, HelicsTranslatorTypes type, const char* name, HelicsError* err)
{
    auto core = getCoreSharedPtr(cr, err);
    if (!core) {
        return nullptr;
    }
    try {
        auto trans = std::make_unique<helics::TranslatorObject>();

        trans->mTrans = std::make_unique<helics::Translator>(core.get(), AS_STRING_VIEW(name));
        trans->mTrans->setTranslatorType(type);
        trans->transPtr = trans->mTrans.get();
        trans->corePtr = std::move(core);
        trans->custom = (type == HELICS_TRANSLATOR_TYPE_CUSTOM);
        return coreAddTranslator(cr, std::move(trans));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}